

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O2

void Bmc_ManBCorePerform(Gia_Man_t *p,Bmc_BCorePar_t *pPars)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  clock_t cVar6;
  sat_solver *s;
  long lVar7;
  abctime aVar8;
  Vec_Int_t *vVarMap;
  Vec_Int_t *pVVar9;
  clock_t cVar10;
  Sto_Man_t *pCnf;
  Intp_Man_t *p_00;
  FILE *__stream;
  abctime time;
  abctime time_00;
  char *pcVar11;
  timespec local_40;
  
  cVar6 = clock();
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,1000);
  iVar4 = pPars->nTimeOut;
  if ((long)iVar4 == 0) {
    aVar8 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    aVar8 = lVar7 + (long)iVar4 * 1000000;
  }
  s->nRuntimeLimit = aVar8;
  vVarMap = Bmc_ManBCoreCollect(p,pPars->iFrame,pPars->iOutput,s);
  sat_solver_store_mark_roots(s);
  if (pPars->pFilePivots != (char *)0x0) {
    pVVar9 = Bmc_ManBCoreCollectPivots(p,pPars->pFilePivots,vVarMap);
    piVar2 = pVVar9->pArray;
    iVar4 = pVVar9->nSize;
    (s->pivot_vars).cap = iVar4;
    (s->pivot_vars).size = iVar4;
    (s->pivot_vars).ptr = piVar2;
    pVVar9->nCap = 0;
    pVVar9->nSize = 0;
    pVVar9->pArray = (int *)0x0;
    Vec_IntFree(pVVar9);
  }
  iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
  if (iVar4 == 1) {
    Vec_IntFree(vVarMap);
    sat_solver_delete(s);
    pcVar11 = "The BMC problem is SAT.";
  }
  else {
    if (iVar4 != 0) {
      if (pPars->fVerbose != 0) {
        pcVar11 = (char *)(ulong)(uint)(s->stats).conflicts;
        printf("SAT solver returned UNSAT after %7d conflicts.      ");
        cVar10 = clock();
        Abc_PrintTime((int)cVar10 - (int)cVar6,pcVar11,time);
      }
      if (iVar4 == -1) {
        pCnf = (Sto_Man_t *)sat_solver_store_release(s);
        cVar6 = clock();
        p_00 = Intp_ManAlloc();
        pVVar9 = (Vec_Int_t *)Intp_ManUnsatCore(p_00,pCnf,1,pPars->fVerbose);
        Intp_ManFree(p_00);
        if (pPars->fVerbose != 0) {
          uVar1 = pVVar9->nSize;
          uVar5 = sat_solver_nconflicts(s);
          pcVar11 = (char *)(ulong)uVar1;
          printf("UNSAT core contains %d (out of %d) learned clauses.   ",pcVar11,(ulong)uVar5);
          cVar10 = clock();
          Abc_PrintTime((int)cVar10 - (int)cVar6,pcVar11,time_00);
        }
        qsort(pVVar9->pArray,(long)pVVar9->nSize,4,Vec_IntSortCompare1);
        __stream = _stdout;
        if (pPars->pFileProof != (char *)0x0) {
          __stream = fopen(pPars->pFileProof,"wb");
        }
        Intp_ManUnsatCorePrintForBmc((FILE *)__stream,pCnf,pVVar9,vVarMap);
        if (__stream != _stdout) {
          fclose(__stream);
        }
        Sto_ManFree(pCnf);
        Vec_IntFree(vVarMap);
        Vec_IntFree(pVVar9);
        sat_solver_delete(s);
        return;
      }
      __assert_fail("RetValue == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                    ,0xf1,"void Bmc_ManBCorePerform(Gia_Man_t *, Bmc_BCorePar_t *)");
    }
    Vec_IntFree(vVarMap);
    sat_solver_delete(s);
    pcVar11 = "Timeout of conflict limit is reached.";
  }
  puts(pcVar11);
  return;
}

Assistant:

void Bmc_ManBCorePerform( Gia_Man_t * p, Bmc_BCorePar_t * pPars )
{
    clock_t clk = clock();
    Intp_Man_t * pManProof;
    Vec_Int_t * vVarMap, * vCore;
    sat_solver * pSat;
    FILE * pFile;
    void * pSatCnf; 
    int RetValue;
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, 1000 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    vVarMap = Bmc_ManBCoreCollect( p, pPars->iFrame, pPars->iOutput, pSat );
    sat_solver_store_mark_roots( pSat ); 
    // create pivot variables
    if ( pPars->pFilePivots )
    {
        Vec_Int_t * vPivots = Bmc_ManBCoreCollectPivots(p, pPars->pFilePivots, vVarMap);
        sat_solver_set_pivot_variables( pSat, Vec_IntArray(vPivots), Vec_IntSize(vPivots) );
        Vec_IntReleaseArray( vPivots );
        Vec_IntFree( vPivots );
    }
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_Undef )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "Timeout of conflict limit is reached.\n" );
        return;
    }
    if ( RetValue == l_True )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "The BMC problem is SAT.\n" );
        return;
    }
    if ( pPars->fVerbose )
    {
        printf( "SAT solver returned UNSAT after %7d conflicts.      ", (int)pSat->stats.conflicts );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
//    Sto_ManDumpClauses( (Sto_Man_t *)pSatCnf, "cnf_store.txt" );
    // derive the UNSAT core
    clk = clock();
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 1, pPars->fVerbose );
    Intp_ManFree( pManProof );
    if ( pPars->fVerbose )
    {
        printf( "UNSAT core contains %d (out of %d) learned clauses.   ", Vec_IntSize(vCore), sat_solver_nconflicts(pSat) );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    // write the problem
    Vec_IntSort( vCore, 0 );
    pFile = pPars->pFileProof ? fopen( pPars->pFileProof, "wb" ) : stdout;
    Intp_ManUnsatCorePrintForBmc( pFile, (Sto_Man_t *)pSatCnf, vCore, vVarMap );
    if ( pFile != stdout )
        fclose( pFile );
    // cleanup
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    Vec_IntFree( vVarMap );
    Vec_IntFree( vCore );
    sat_solver_delete( pSat );
}